

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O2

void __thiscall
enact::TupleTypename::TupleTypename
          (TupleTypename *this,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *elementTypenames,Token *paren)

{
  pointer puVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *elementTypename;
  pointer puVar4;
  string separator;
  string local_1c8 [32];
  ostringstream name;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__TupleTypename_00124950;
  puVar4 = (elementTypenames->
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_elementTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (elementTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_elementTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  (this->m_elementTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (elementTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (elementTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (elementTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (elementTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Token::Token(&this->m_paren,paren);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
  separator._M_dataplus._M_p = (pointer)&separator.field_2;
  separator._M_string_length = 0;
  separator.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&name,'(');
  puVar1 = (this->m_elementTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_elementTypenames).
                super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&name,(string *)&separator);
    iVar2 = (*((puVar4->_M_t).
               super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
               .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename
              [4])();
    std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::assign((char *)&separator);
  }
  std::operator<<((ostream *)&name,')');
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_name,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string((string *)&separator);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  return;
}

Assistant:

TupleTypename::TupleTypename(std::vector<std::unique_ptr<const Typename>> elementTypenames, Token paren) :
            m_elementTypenames{std::move(elementTypenames)},
            m_paren{std::move(paren)} {
        std::ostringstream name;
        std::string separator;

        name << '(';
        for (const auto& elementTypename : m_elementTypenames) {
            name << separator << elementTypename->name();
            separator = ", ";
        }
        name << ')';

        m_name = name.str();
    }